

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLExportTest.cpp
# Opt level: O0

void __thiscall
ODDLParser::OpenDDLExportTest_writeBoolTest_Test::~OpenDDLExportTest_writeBoolTest_Test
          (OpenDDLExportTest_writeBoolTest_Test *this)

{
  OpenDDLExportTest_writeBoolTest_Test *this_local;
  
  OpenDDLExportTest::~OpenDDLExportTest(&this->super_OpenDDLExportTest);
  return;
}

Assistant:

TEST_F(OpenDDLExportTest, writeBoolTest) {
    OpenDDLExportMock myExport;
    Value *v = ValueAllocator::allocPrimData(Value::ValueType::ddl_bool);
    v->setBool(true);

    std::string statement;
    bool ok(true);
    ok = myExport.writeValueTester(v, statement);
    EXPECT_TRUE(ok);
    EXPECT_EQ("true", statement);

    v->setBool(false);
    statement.clear();
    ok = myExport.writeValueTester(v, statement);
    EXPECT_TRUE(ok);
    EXPECT_EQ("false", statement);

    ValueAllocator::releasePrimData(&v);
}